

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

EnumValueDescriptorProto *
google::protobuf::descriptor_unittest::AddEnumValue
          (EnumDescriptorProto *enum_proto,string *name,int number)

{
  EnumValueDescriptorProto *this;
  uint32_t *puVar1;
  Arena *arena;
  EnumValueDescriptorProto *result;
  int number_local;
  string *name_local;
  EnumDescriptorProto *enum_proto_local;
  
  this = EnumDescriptorProto::add_value(enum_proto);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this);
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,name,arena);
  EnumValueDescriptorProto::set_number(this,number);
  return this;
}

Assistant:

EnumValueDescriptorProto* AddEnumValue(EnumDescriptorProto* enum_proto,
                                       const std::string& name, int number) {
  EnumValueDescriptorProto* result = enum_proto->add_value();
  result->set_name(name);
  result->set_number(number);
  return result;
}